

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O1

int __thiscall FIX::CheckSumField::getValue(CheckSumField *this)

{
  signed_int sVar1;
  
  sVar1 = IntConvertor::convert(&(this->super_FieldBase).m_string);
  return sVar1;
}

Assistant:

int getValue() const EXCEPT ( IncorrectDataFormat )
    { try
      { return CheckSumConvertor::convert( getString() ); }
      catch( FieldConvertError& )
      { throw IncorrectDataFormat( getTag(), getString() ); } }